

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipeline_executor.cpp
# Opt level: O2

void __thiscall
duckdb::PipelineExecutor::PipelineExecutor
          (PipelineExecutor *this,ClientContext *context_p,Pipeline *pipeline_p)

{
  unique_ptr<duckdb::LocalSinkState,_std::default_delete<duckdb::LocalSinkState>,_true> *this_00;
  ExecutionContext *pEVar1;
  _Head_base<0UL,_duckdb::LocalSinkState_*,_false> _Var2;
  _Head_base<0UL,_duckdb::LocalSourceState_*,_false> _Var3;
  Pipeline *pPVar4;
  PhysicalOperator *pPVar5;
  templated_unique_single_t tVar6;
  int iVar7;
  PhysicalOperator *pPVar8;
  pointer pLVar9;
  idx_t index;
  type pGVar10;
  reference pvVar11;
  pointer this_01;
  Allocator *allocator;
  pointer pGVar12;
  ulong __n;
  templated_unique_single_t chunk;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_60;
  DataChunk *local_48;
  _Head_base<0UL,_duckdb::OperatorState_*,_false> local_40;
  stack<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_> *local_38;
  
  this->pipeline = pipeline_p;
  ThreadContext::ThreadContext(&this->thread,context_p);
  (this->context).client = context_p;
  (this->context).thread = &this->thread;
  (this->context).pipeline.ptr = pipeline_p;
  this_00 = &this->local_sink_state;
  (this->intermediate_chunks).
  super_vector<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->intermediate_chunks).
  super_vector<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->intermediate_chunks).
  super_vector<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->intermediate_states).
  super_vector<duckdb::unique_ptr<duckdb::OperatorState,_std::default_delete<duckdb::OperatorState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::OperatorState,_std::default_delete<duckdb::OperatorState>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::OperatorState,_std::default_delete<duckdb::OperatorState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::OperatorState,_std::default_delete<duckdb::OperatorState>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->intermediate_states).
  super_vector<duckdb::unique_ptr<duckdb::OperatorState,_std::default_delete<duckdb::OperatorState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::OperatorState,_std::default_delete<duckdb::OperatorState>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::OperatorState,_std::default_delete<duckdb::OperatorState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::OperatorState,_std::default_delete<duckdb::OperatorState>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->intermediate_states).
  super_vector<duckdb::unique_ptr<duckdb::OperatorState,_std::default_delete<duckdb::OperatorState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::OperatorState,_std::default_delete<duckdb::OperatorState>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::OperatorState,_std::default_delete<duckdb::OperatorState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::OperatorState,_std::default_delete<duckdb::OperatorState>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->local_source_state).
  super_unique_ptr<duckdb::LocalSourceState,_std::default_delete<duckdb::LocalSourceState>_>._M_t.
  super___uniq_ptr_impl<duckdb::LocalSourceState,_std::default_delete<duckdb::LocalSourceState>_>.
  _M_t.
  super__Tuple_impl<0UL,_duckdb::LocalSourceState_*,_std::default_delete<duckdb::LocalSourceState>_>
  .super__Head_base<0UL,_duckdb::LocalSourceState_*,_false>._M_head_impl = (LocalSourceState *)0x0;
  (this->local_sink_state).
  super_unique_ptr<duckdb::LocalSinkState,_std::default_delete<duckdb::LocalSinkState>_>._M_t.
  super___uniq_ptr_impl<duckdb::LocalSinkState,_std::default_delete<duckdb::LocalSinkState>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::LocalSinkState_*,_std::default_delete<duckdb::LocalSinkState>_>.
  super__Head_base<0UL,_duckdb::LocalSinkState_*,_false>._M_head_impl = (LocalSinkState *)0x0;
  InterruptState::InterruptState(&this->interrupt_state);
  local_48 = &this->final_chunk;
  DataChunk::DataChunk(local_48);
  local_38 = &this->in_process_operators;
  ::std::stack<unsigned_long,std::deque<unsigned_long,std::allocator<unsigned_long>>>::
  stack<std::deque<unsigned_long,std::allocator<unsigned_long>>,void>(local_38);
  pEVar1 = &this->context;
  this->finalized = false;
  this->finished_processing_idx = -1;
  (this->required_partition_info).batch_index = false;
  (this->required_partition_info).partition_columns.
  super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->required_partition_info).partition_columns.
  super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  *(undefined8 *)
   ((long)&(this->required_partition_info).partition_columns.
           super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish + 5) = 0;
  *(undefined8 *)
   ((long)&(this->required_partition_info).partition_columns.
           super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage + 5) = 0;
  this->should_flush_current_idx = true;
  if ((this->pipeline->sink).ptr != (PhysicalOperator *)0x0) {
    pPVar8 = optional_ptr<duckdb::PhysicalOperator,_true>::operator->(&this->pipeline->sink);
    (*pPVar8->_vptr_PhysicalOperator[0x1f])(&chunk,pPVar8,pEVar1);
    tVar6 = chunk;
    chunk.super_unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>_>._M_t.
    super___uniq_ptr_impl<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::DataChunk_*,_std::default_delete<duckdb::DataChunk>_>.
    super__Head_base<0UL,_duckdb::DataChunk_*,_false>._M_head_impl =
         (unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>_>)
         (__uniq_ptr_data<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true,_true>)0x0
    ;
    _Var2._M_head_impl =
         (this_00->
         super_unique_ptr<duckdb::LocalSinkState,_std::default_delete<duckdb::LocalSinkState>_>).
         _M_t.
         super___uniq_ptr_impl<duckdb::LocalSinkState,_std::default_delete<duckdb::LocalSinkState>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::LocalSinkState_*,_std::default_delete<duckdb::LocalSinkState>_>
         .super__Head_base<0UL,_duckdb::LocalSinkState_*,_false>._M_head_impl;
    (this_00->super_unique_ptr<duckdb::LocalSinkState,_std::default_delete<duckdb::LocalSinkState>_>
    )._M_t.
    super___uniq_ptr_impl<duckdb::LocalSinkState,_std::default_delete<duckdb::LocalSinkState>_>._M_t
    .super__Tuple_impl<0UL,_duckdb::LocalSinkState_*,_std::default_delete<duckdb::LocalSinkState>_>.
    super__Head_base<0UL,_duckdb::LocalSinkState_*,_false>._M_head_impl =
         (LocalSinkState *)
         tVar6.super_unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>_>._M_t.
         super___uniq_ptr_impl<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>_>._M_t.
         super__Tuple_impl<0UL,_duckdb::DataChunk_*,_std::default_delete<duckdb::DataChunk>_>.
         super__Head_base<0UL,_duckdb::DataChunk_*,_false>._M_head_impl;
    if (_Var2._M_head_impl != (LocalSinkState *)0x0) {
      (**(code **)((long)(_Var2._M_head_impl)->_vptr_LocalSinkState + 8))();
      if (chunk.super_unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>_>._M_t.
          super___uniq_ptr_impl<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>_>._M_t.
          super__Tuple_impl<0UL,_duckdb::DataChunk_*,_std::default_delete<duckdb::DataChunk>_>.
          super__Head_base<0UL,_duckdb::DataChunk_*,_false>._M_head_impl !=
          (__uniq_ptr_data<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true,_true>)
          0x0) {
        (**(code **)(*(long *)chunk.
                              super_unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>_>
                              ._M_t.
                              super___uniq_ptr_impl<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_duckdb::DataChunk_*,_std::default_delete<duckdb::DataChunk>_>
                              .super__Head_base<0UL,_duckdb::DataChunk_*,_false>._M_head_impl + 8))
                  ();
      }
    }
    pPVar8 = optional_ptr<duckdb::PhysicalOperator,_true>::operator->(&this->pipeline->sink);
    (*pPVar8->_vptr_PhysicalOperator[0x23])(&chunk,pPVar8);
    OperatorPartitionInfo::operator=(&this->required_partition_info,(OperatorPartitionInfo *)&chunk)
    ;
    ::std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_60);
    if (((this->required_partition_info).partition_columns.
         super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_start !=
         (this->required_partition_info).partition_columns.
         super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_finish) ||
       (((this->required_partition_info).batch_index & 1U) != 0)) {
      pLVar9 = unique_ptr<duckdb::LocalSinkState,_std::default_delete<duckdb::LocalSinkState>,_true>
               ::operator->(this_00);
      index = Pipeline::RegisterNewBatchIndex(this->pipeline);
      optional_idx::optional_idx((optional_idx *)&chunk,index);
      (pLVar9->partition_info).batch_index.index =
           (idx_t)chunk.super_unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>_>
                  ._M_t.
                  super___uniq_ptr_impl<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>_>.
                  _M_t.
                  super__Tuple_impl<0UL,_duckdb::DataChunk_*,_std::default_delete<duckdb::DataChunk>_>
                  .super__Head_base<0UL,_duckdb::DataChunk_*,_false>._M_head_impl;
      (pLVar9->partition_info).min_batch_index.index =
           (idx_t)chunk.super_unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>_>
                  ._M_t.
                  super___uniq_ptr_impl<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>_>.
                  _M_t.
                  super__Tuple_impl<0UL,_duckdb::DataChunk_*,_std::default_delete<duckdb::DataChunk>_>
                  .super__Head_base<0UL,_duckdb::DataChunk_*,_false>._M_head_impl;
    }
  }
  pPVar8 = optional_ptr<duckdb::PhysicalOperator,_true>::operator->(&this->pipeline->source);
  pGVar10 = unique_ptr<duckdb::GlobalSourceState,_std::default_delete<duckdb::GlobalSourceState>,_true>
            ::operator*(&this->pipeline->source_state);
  (*pPVar8->_vptr_PhysicalOperator[0xf])(&chunk,pPVar8,pEVar1,pGVar10);
  tVar6 = chunk;
  chunk.super_unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>_>._M_t.
  super___uniq_ptr_impl<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::DataChunk_*,_std::default_delete<duckdb::DataChunk>_>.
  super__Head_base<0UL,_duckdb::DataChunk_*,_false>._M_head_impl =
       (unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>_>)
       (__uniq_ptr_data<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true,_true>)0x0;
  _Var3._M_head_impl =
       (this->local_source_state).
       super_unique_ptr<duckdb::LocalSourceState,_std::default_delete<duckdb::LocalSourceState>_>.
       _M_t.
       super___uniq_ptr_impl<duckdb::LocalSourceState,_std::default_delete<duckdb::LocalSourceState>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::LocalSourceState_*,_std::default_delete<duckdb::LocalSourceState>_>
       .super__Head_base<0UL,_duckdb::LocalSourceState_*,_false>._M_head_impl;
  (this->local_source_state).
  super_unique_ptr<duckdb::LocalSourceState,_std::default_delete<duckdb::LocalSourceState>_>._M_t.
  super___uniq_ptr_impl<duckdb::LocalSourceState,_std::default_delete<duckdb::LocalSourceState>_>.
  _M_t.
  super__Tuple_impl<0UL,_duckdb::LocalSourceState_*,_std::default_delete<duckdb::LocalSourceState>_>
  .super__Head_base<0UL,_duckdb::LocalSourceState_*,_false>._M_head_impl =
       (LocalSourceState *)
       tVar6.super_unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>_>._M_t.
       super___uniq_ptr_impl<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::DataChunk_*,_std::default_delete<duckdb::DataChunk>_>.
       super__Head_base<0UL,_duckdb::DataChunk_*,_false>._M_head_impl;
  if (_Var3._M_head_impl != (LocalSourceState *)0x0) {
    (*(_Var3._M_head_impl)->_vptr_LocalSourceState[1])();
    if (chunk.super_unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>_>._M_t.
        super___uniq_ptr_impl<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>_>._M_t.
        super__Tuple_impl<0UL,_duckdb::DataChunk_*,_std::default_delete<duckdb::DataChunk>_>.
        super__Head_base<0UL,_duckdb::DataChunk_*,_false>._M_head_impl !=
        (__uniq_ptr_data<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true,_true>)0x0)
    {
      (**(code **)(*(long *)chunk.
                            super_unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>_>
                            ._M_t.
                            super___uniq_ptr_impl<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_duckdb::DataChunk_*,_std::default_delete<duckdb::DataChunk>_>
                            .super__Head_base<0UL,_duckdb::DataChunk_*,_false>._M_head_impl + 8))();
    }
  }
  std::
  vector<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>_>_>
  ::reserve((vector<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>_>_>
             *)&this->intermediate_chunks,
            (long)(this->pipeline->operators).
                  super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
                  .
                  super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(this->pipeline->operators).
                  super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
                  .
                  super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 3);
  ::std::
  vector<duckdb::unique_ptr<duckdb::OperatorState,_std::default_delete<duckdb::OperatorState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::OperatorState,_std::default_delete<duckdb::OperatorState>,_true>_>_>
  ::reserve(&(this->intermediate_states).
             super_vector<duckdb::unique_ptr<duckdb::OperatorState,_std::default_delete<duckdb::OperatorState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::OperatorState,_std::default_delete<duckdb::OperatorState>,_true>_>_>
            ,(long)(this->pipeline->operators).
                   super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
                   .
                   super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->pipeline->operators).
                   super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
                   .
                   super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 3);
  for (__n = 0; pPVar4 = this->pipeline,
      __n < (ulong)((long)(pPVar4->operators).
                          super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
                          .
                          super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(pPVar4->operators).
                          super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
                          .
                          super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 3); __n = __n + 1) {
    if (__n == 0) {
      pPVar8 = optional_ptr<duckdb::PhysicalOperator,_true>::operator*(&pPVar4->source);
    }
    else {
      pvVar11 = vector<std::reference_wrapper<duckdb::PhysicalOperator>,_true>::get<true>
                          (&pPVar4->operators,__n - 1);
      pPVar8 = pvVar11->_M_data;
    }
    pvVar11 = vector<std::reference_wrapper<duckdb::PhysicalOperator>,_true>::get<true>
                        (&this->pipeline->operators,__n);
    pPVar5 = pvVar11->_M_data;
    make_uniq<duckdb::DataChunk>();
    this_01 = unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>::
              operator->((unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>
                          *)&chunk.
                             super_unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>_>
                        );
    allocator = Allocator::Get(pEVar1->client);
    DataChunk::Initialize(this_01,allocator,&pPVar8->types,0x800);
    ::std::
    vector<duckdb::unique_ptr<duckdb::DataChunk,std::default_delete<duckdb::DataChunk>,true>,std::allocator<duckdb::unique_ptr<duckdb::DataChunk,std::default_delete<duckdb::DataChunk>,true>>>
    ::
    emplace_back<duckdb::unique_ptr<duckdb::DataChunk,std::default_delete<duckdb::DataChunk>,true>>
              ((vector<duckdb::unique_ptr<duckdb::DataChunk,std::default_delete<duckdb::DataChunk>,true>,std::allocator<duckdb::unique_ptr<duckdb::DataChunk,std::default_delete<duckdb::DataChunk>,true>>>
                *)&this->intermediate_chunks,
               (unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true> *)
               &chunk.super_unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>_>);
    (*pPVar5->_vptr_PhysicalOperator[8])(&local_40,pPVar5,pEVar1);
    ::std::
    vector<duckdb::unique_ptr<duckdb::OperatorState,std::default_delete<duckdb::OperatorState>,true>,std::allocator<duckdb::unique_ptr<duckdb::OperatorState,std::default_delete<duckdb::OperatorState>,true>>>
    ::
    emplace_back<duckdb::unique_ptr<duckdb::OperatorState,std::default_delete<duckdb::OperatorState>,true>>
              ((vector<duckdb::unique_ptr<duckdb::OperatorState,std::default_delete<duckdb::OperatorState>,true>,std::allocator<duckdb::unique_ptr<duckdb::OperatorState,std::default_delete<duckdb::OperatorState>,true>>>
                *)&this->intermediate_states,
               (unique_ptr<duckdb::OperatorState,_std::default_delete<duckdb::OperatorState>,_true>
                *)&local_40);
    iVar7 = (*pPVar5->_vptr_PhysicalOperator[0x21])(pPVar5);
    if ((char)iVar7 != '\0') {
      pGVar12 = unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>,_true>
                ::operator->(&pPVar5->sink_state);
      if (pGVar12->state == NO_OUTPUT_POSSIBLE) {
        FinishProcessing(this,-1);
      }
    }
    if (local_40._M_head_impl != (OperatorState *)0x0) {
      (*(local_40._M_head_impl)->_vptr_OperatorState[1])();
    }
    ::std::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>_>::~unique_ptr
              (&chunk.super_unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>_>);
  }
  InitializeChunk(this,local_48);
  return;
}

Assistant:

PipelineExecutor::PipelineExecutor(ClientContext &context_p, Pipeline &pipeline_p)
    : pipeline(pipeline_p), thread(context_p), context(context_p, thread, &pipeline_p) {
	D_ASSERT(pipeline.source_state);
	if (pipeline.sink) {
		local_sink_state = pipeline.sink->GetLocalSinkState(context);
		required_partition_info = pipeline.sink->RequiredPartitionInfo();
		if (required_partition_info.AnyRequired()) {
			D_ASSERT(pipeline.source->SupportsPartitioning(OperatorPartitionInfo::BatchIndex()));
			auto &partition_info = local_sink_state->partition_info;
			D_ASSERT(!partition_info.batch_index.IsValid());
			// batch index is not set yet - initialize before fetching anything
			partition_info.batch_index = pipeline.RegisterNewBatchIndex();
			partition_info.min_batch_index = partition_info.batch_index;
		}
	}
	local_source_state = pipeline.source->GetLocalSourceState(context, *pipeline.source_state);

	intermediate_chunks.reserve(pipeline.operators.size());
	intermediate_states.reserve(pipeline.operators.size());
	for (idx_t i = 0; i < pipeline.operators.size(); i++) {
		auto &prev_operator = i == 0 ? *pipeline.source : pipeline.operators[i - 1].get();
		auto &current_operator = pipeline.operators[i].get();

		auto chunk = make_uniq<DataChunk>();
		chunk->Initialize(Allocator::Get(context.client), prev_operator.GetTypes());
		intermediate_chunks.push_back(std::move(chunk));

		auto op_state = current_operator.GetOperatorState(context);
		intermediate_states.push_back(std::move(op_state));

		if (current_operator.IsSink() && current_operator.sink_state->state == SinkFinalizeType::NO_OUTPUT_POSSIBLE) {
			// one of the operators has already figured out no output is possible
			// we can skip executing the pipeline
			FinishProcessing();
		}
	}
	InitializeChunk(final_chunk);
}